

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::ReadBinaryInterp
          (interp *this,string_view filename,void *data,size_t size,ReadBinaryOptions *options,
          Errors *errors,ModuleDesc *out_module)

{
  Result RVar1;
  BinaryReaderInterp reader;
  Features local_3f8;
  BinaryReaderInterp local_3e0;
  
  local_3e0.super_BinaryReaderNop.super_BinaryReaderDelegate.state = (State *)0x0;
  local_3e0.super_BinaryReaderNop.super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderInterp_0022be58;
  local_3e0.module_ = (ModuleDesc *)errors;
  local_3e0.istream_ = (Istream *)(errors + 0xb);
  local_3f8._16_2_ = *(undefined2 *)(size + 0x10);
  local_3f8._0_8_ = *(undefined8 *)size;
  local_3f8._8_8_ = *(undefined8 *)(size + 8);
  local_3e0.errors_ = (Errors *)options;
  SharedValidator::SharedValidator
            (&local_3e0.validator_,(Errors *)options,(ValidateOptions *)&local_3f8);
  local_3e0.label_stack_.
  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e0.label_stack_.
  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e0.label_stack_.
  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3e0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3e0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3e0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3e0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3e0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3e0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3e0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3e0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_3e0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3e0.func_types_.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e0.func_types_.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e0.func_types_.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e0.table_types_.
  super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e0.table_types_.
  super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e0.table_types_.
  super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e0.memory_types_.
  super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e0.memory_types_.
  super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e0.memory_types_.
  super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e0.global_types_.
  super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e0.global_types_.
  super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e0.global_types_.
  super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e0.tag_types_.
  super__Vector_base<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e0.tag_types_.
  super__Vector_base<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e0.tag_types_.
  super__Vector_base<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3e0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3e0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3e0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3e0.filename_._M_len = (size_t)this;
  local_3e0.filename_._M_str = (char *)filename._M_len;
  RVar1 = ReadBinary(filename._M_str,(size_t)data,(BinaryReaderDelegate *)&local_3e0,
                     (ReadBinaryOptions *)size);
  anon_unknown_1::BinaryReaderInterp::~BinaryReaderInterp(&local_3e0);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryInterp(std::string_view filename,
                        const void* data,
                        size_t size,
                        const ReadBinaryOptions& options,
                        Errors* errors,
                        ModuleDesc* out_module) {
  BinaryReaderInterp reader(out_module, filename, errors, options.features);
  return ReadBinary(data, size, &reader, options);
}